

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffghps(fitsfile *fptr,int *nexist,int *position,int *status)

{
  FITSfile *pFVar1;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (nexist != (int *)0x0) {
    pFVar1 = fptr->Fptr;
    *nexist = (int)((pFVar1->headend - pFVar1->headstart[pFVar1->curhdu]) / 0x50);
  }
  if (position != (int *)0x0) {
    pFVar1 = fptr->Fptr;
    *position = (int)((pFVar1->nextkey - pFVar1->headstart[pFVar1->curhdu]) / 0x50) + 1;
  }
  return *status;
}

Assistant:

int ffghps(fitsfile *fptr, /* I - FITS file pointer                     */
          int *nexist,     /* O - number of existing keywords in header */
          int *position,   /* O - position of next keyword to be read   */
          int *status)     /* IO - error status                         */
/*
  return the number of existing keywords and the position of the next
  keyword that will be read.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nexist)
      *nexist = (int) (( ((fptr->Fptr)->headend) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80);

    if (position)
      *position = (int) (( ((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80 + 1);

    return(*status);
}